

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O2

void * zexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  sbyte sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ExpHeader *pEVar4;
  char *src;
  int iVar5;
  int_t *piVar6;
  int iVar7;
  ulong uVar8;
  MemType MVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  float fVar16;
  float local_44;
  
  pEVar4 = Glu->expanders;
  iVar5 = *prev_len;
  iVar14 = (int)((float)iVar5 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar14 = iVar5;
  }
  if (keep_prev != 0) {
    iVar14 = iVar5;
  }
  MVar9 = type & ~UCOL;
  if (Glu->MemModel == SYSTEM) {
    sVar1 = (MVar9 != LSUB) * '\x02' + 2;
    pvVar12 = superlu_malloc((long)iVar14 << sVar1);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        local_44 = 1.5;
        iVar5 = 10;
        while (pvVar12 == (void *)0x0) {
          bVar15 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if (bVar15) {
            return (void *)0x0;
          }
          local_44 = (local_44 + 1.0) * 0.5;
          iVar14 = (int)((float)*prev_len * local_44);
          pvVar12 = superlu_malloc((long)iVar14 << sVar1);
        }
      }
      else if (pvVar12 == (void *)0x0) {
        return (void *)0x0;
      }
      if (MVar9 == LSUB) {
        copy_mem_int(len_to_copy,pEVar4[type].mem,pvVar12);
      }
      else {
        copy_mem_doublecomplex(len_to_copy,pEVar4[type].mem,pvVar12);
      }
      superlu_free(pEVar4[type].mem);
    }
    pEVar4[type].mem = pvVar12;
  }
  else if (Glu->num_expansions == 0) {
    pvVar12 = zuser_malloc(iVar14 << (MVar9 != LSUB) * '\x02' + 2,0,Glu);
    if ((type < LSUB) && (iVar5 = (int)pvVar12, ((ulong)pvVar12 & 7) != 0)) {
      uVar8 = (long)pvVar12 + 7;
      pvVar12 = (void *)(uVar8 & 0xfffffffffffffff8);
      iVar5 = ((uint)uVar8 & 0xfffffff8) - iVar5;
      uVar2 = (Glu->stack).used;
      uVar3 = (Glu->stack).top1;
      (Glu->stack).used = iVar5 + uVar2;
      (Glu->stack).top1 = iVar5 + uVar3;
    }
    pEVar4[type].mem = pvVar12;
  }
  else {
    sVar1 = (MVar9 != LSUB) * '\x02' + 2;
    iVar13 = iVar14 - iVar5 << sVar1;
    iVar7 = (Glu->stack).used;
    if (keep_prev == 0) {
      fVar16 = 1.5;
      iVar10 = 10;
      while ((Glu->stack).size <= iVar7 + iVar13) {
        bVar15 = iVar10 == 0;
        iVar10 = iVar10 + -1;
        if (bVar15) {
          return (void *)0x0;
        }
        fVar16 = (fVar16 + 1.0) * 0.5;
        iVar14 = (int)(fVar16 * (float)iVar5);
        iVar13 = iVar14 - iVar5 << sVar1;
      }
    }
    else if ((Glu->stack).size <= iVar7 + iVar13) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar4[type + UCOL].mem;
      lVar11 = (long)iVar13;
      user_bcopy(src,src + lVar11,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar6 = (int_t *)((long)pEVar4[3].mem + lVar11);
        pEVar4[3].mem = piVar6;
        Glu->usub = piVar6;
        if (type != LSUB) {
          piVar6 = (int_t *)((long)pEVar4[2].mem + lVar11);
          pEVar4[2].mem = piVar6;
          Glu->lsub = piVar6;
          if (type == LUSUP) {
            pvVar12 = (void *)(lVar11 + (long)pEVar4[1].mem);
            pEVar4[1].mem = pvVar12;
            Glu->ucol = pvVar12;
          }
        }
      }
      iVar5 = (Glu->stack).top1 + iVar13;
      (Glu->stack).top1 = iVar5;
      iVar7 = (Glu->stack).used + iVar13;
      (Glu->stack).used = iVar7;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar5 + iVar13;
        (Glu->stack).used = iVar7 + iVar13;
      }
    }
  }
  pEVar4[type].size = iVar14;
  *prev_len = iVar14;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar4[type].mem;
}

Assistant:

void
*zexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(doublecomplex);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_doublecomplex(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = zuser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}